

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

void HTS_Label_load_from_strings
               (HTS_Label *label,size_t sampling_rate,size_t fperiod,char **lines,size_t num_lines)

{
  HTS_Boolean HVar1;
  ushort **ppuVar2;
  _HTS_LabelString *p_Var3;
  char *pcVar4;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  HTS_Label *in_RDI;
  ulong in_R8;
  char *str;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double rate;
  double end;
  double start;
  size_t data_index;
  size_t i;
  HTS_LabelString *lstring;
  char buff [1024];
  char *in_stack_fffffffffffffbb0;
  double in_stack_fffffffffffffbb8;
  size_t local_440;
  ulong local_438;
  HTS_LabelString *local_430;
  char local_428 [144];
  
  local_430 = (HTS_LabelString *)0x0;
  auVar5._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar5._0_8_ = in_RSI;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)((ulong)in_RDX >> 0x20);
  auVar6._0_8_ = in_RDX;
  auVar6._12_4_ = 0x45300000;
  str = (char *)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) /
                (((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) * 10000000.0));
  if ((in_RDI->head == (HTS_LabelString *)0x0) && (in_RDI->size == 0)) {
    local_438 = 0;
    while ((local_438 < in_R8 &&
           (ppuVar2 = __ctype_b_loc(),
           ((*ppuVar2)[(int)**(char **)(in_RCX + local_438 * 8)] & 0x8000) != 0))) {
      in_RDI->size = in_RDI->size + 1;
      if (local_430 == (HTS_LabelString *)0x0) {
        local_430 = (HTS_LabelString *)
                    HTS_calloc((size_t)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
        in_RDI->head = local_430;
      }
      else {
        p_Var3 = (_HTS_LabelString *)
                 HTS_calloc((size_t)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
        local_430->next = p_Var3;
        local_430 = local_430->next;
      }
      local_440 = 0;
      HVar1 = isdigit_string(str);
      if (HVar1 == '\0') {
        local_430->start = -1.0;
        local_430->end = -1.0;
        pcVar4 = HTS_strdup(in_stack_fffffffffffffbb0);
        local_430->name = pcVar4;
      }
      else {
        HTS_get_token_from_string(*(char **)(in_RCX + local_438 * 8),&local_440,local_428);
        in_stack_fffffffffffffbb8 = atof(local_428);
        HTS_get_token_from_string(*(char **)(in_RCX + local_438 * 8),&local_440,local_428);
        in_stack_fffffffffffffbb0 = (char *)atof(local_428);
        HTS_get_token_from_string(*(char **)(in_RCX + local_438 * 8),&local_440,local_428);
        pcVar4 = HTS_strdup(in_stack_fffffffffffffbb0);
        local_430->name = pcVar4;
        local_430->start = (double)str * in_stack_fffffffffffffbb8;
        local_430->end = (double)str * (double)in_stack_fffffffffffffbb0;
      }
      local_430->next = (_HTS_LabelString *)0x0;
      local_438 = local_438 + 1;
    }
    HTS_Label_check_time(in_RDI);
  }
  else {
    HTS_error(1,"HTS_Label_load_from_fp: label list is not initialized.\n");
  }
  return;
}

Assistant:

void HTS_Label_load_from_strings(HTS_Label * label, size_t sampling_rate, size_t fperiod, char **lines, size_t num_lines)
{
   char buff[HTS_MAXBUFLEN];
   HTS_LabelString *lstring = NULL;
   size_t i;
   size_t data_index;
   double start, end;
   const double rate = (double) sampling_rate / ((double) fperiod * 1e+7);

   if (label->head || label->size != 0) {
      HTS_error(1, "HTS_Label_load_from_fp: label list is not initialized.\n");
      return;
   }
   /* copy label */
   for (i = 0; i < num_lines; i++) {
      if (!isgraph((int) lines[i][0]))
         break;
      label->size++;

      if (lstring) {
         lstring->next = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         lstring = lstring->next;
      } else {                  /* first time */
         lstring = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         label->head = lstring;
      }
      data_index = 0;
      if (isdigit_string(lines[i])) {   /* has frame infomation */
         HTS_get_token_from_string(lines[i], &data_index, buff);
         start = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         end = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         lstring->name = HTS_strdup(buff);
         lstring->start = rate * start;
         lstring->end = rate * end;
      } else {
         lstring->start = -1.0;
         lstring->end = -1.0;
         lstring->name = HTS_strdup(lines[i]);
      }
      lstring->next = NULL;
   }
   HTS_Label_check_time(label);
}